

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
detail::reader::operator()(reader *this,optional_field<example::exercise_t,_0UL> *val)

{
  reference_type pbVar1;
  undefined8 uVar2;
  exercise_t v;
  
  if ((this->opts_).super_type.m_initialized != false) {
    pbVar1 = boost::optional<std::bitset<16UL>_>::get(&this->opts_);
    if (((pbVar1->super__Base_bitset<1UL>)._M_w & 1) != 0) {
      operator()(this,&v);
      (val->super_optional<example::exercise_t>).super_type = (type)((ushort)v * 0x100 + 1);
    }
    return;
  }
  uVar2 = __cxa_allocate_exception(0x40);
  bad_message();
  __cxa_throw(uVar2,&boost::system::system_error::typeinfo,
              boost::system::system_error::~system_error);
}

Assistant:

void operator()(example::optional_field<T, N> & val) const {
        if (!opts_)
            throw bad_message();
        if ((*opts_)[N]) {
            T v;
            (*this)(v);
            val = example::optional_field<T, N>(std::move(v));
        }
    }